

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knownhost.c
# Opt level: O0

int libssh2_knownhost_writeline
              (LIBSSH2_KNOWNHOSTS *hosts,libssh2_knownhost *known,char *buffer,size_t buflen,
              size_t *outlen,int type)

{
  known_host *node;
  int type_local;
  size_t *outlen_local;
  size_t buflen_local;
  char *buffer_local;
  libssh2_knownhost *known_local;
  LIBSSH2_KNOWNHOSTS *hosts_local;
  
  if (known->magic == 0xdeadcafe) {
    hosts_local._4_4_ =
         knownhost_writeline(hosts,(known_host *)known->node,buffer,buflen,outlen,type);
  }
  else {
    hosts_local._4_4_ = _libssh2_error(hosts->session,-0x22,"Invalid host information");
  }
  return hosts_local._4_4_;
}

Assistant:

LIBSSH2_API int
libssh2_knownhost_writeline(LIBSSH2_KNOWNHOSTS *hosts,
                            struct libssh2_knownhost *known,
                            char *buffer, size_t buflen,
                            size_t *outlen, /* the amount of written data */
                            int type)
{
    struct known_host *node;

    if(known->magic != KNOWNHOST_MAGIC)
        return _libssh2_error(hosts->session, LIBSSH2_ERROR_INVAL,
                              "Invalid host information");

    node = known->node;

    return knownhost_writeline(hosts, node, buffer, buflen, outlen, type);
}